

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.c
# Opt level: O2

axbStatus_t axbMatGetNonzerosSize(axbMat_s *mat,size_t *num_nonzeros)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  
  if (mat->storage_type == AXB_STORAGE_DENSE) {
    lVar2 = 0;
    sVar1 = 0;
    for (sVar3 = 0; sVar3 != mat->rows; sVar3 = sVar3 + 1) {
      sVar4 = mat->cols;
      lVar5 = sVar4 * lVar2;
      while (bVar6 = sVar4 != 0, sVar4 = sVar4 - 1, bVar6) {
        sVar1 = sVar1 + (*(double *)((long)mat->values + lVar5) != 0.0);
        lVar5 = lVar5 + 8;
      }
      lVar2 = lVar2 + 8;
    }
  }
  else {
    sVar1 = mat->nonzeros;
  }
  *num_nonzeros = sVar1;
  return 0;
}

Assistant:

axbStatus_t axbMatGetNonzerosSize(const struct axbMat_s *mat, size_t *num_nonzeros)
{
  if (mat->storage_type == AXB_STORAGE_DENSE) { // count the number of actual nonzeros
    size_t nnz = 0;
    for (size_t i=0; i<mat->rows; ++i)
      for (size_t j=0; j<mat->cols; ++j) {
        double val = ((double*)mat->values)[i*mat->cols + j];
        if (val < 0 || val > 0) ++nnz;
      }
    *num_nonzeros = nnz;
  } else {
    *num_nonzeros = mat->nonzeros;
  }
  return 0;
}